

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaShrink6.c
# Opt level: O1

int Shr_ObjPerformBidec(Shr_Man_t *p,Bdc_Man_t *pManDec,Gia_Man_t *pNew,Vec_Int_t *vLeafLits,
                       word uTruth1,word uTruthC)

{
  Gia_Obj_t *pGVar1;
  Gia_Obj_t *pGVar2;
  Vec_Int_t *pVVar3;
  Gia_Obj_t *pGVar4;
  int *piVar5;
  Vec_Wrd_t *pVVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  Bdc_Fun_t *pBVar11;
  Bdc_Fun_t *pBVar12;
  Bdc_Fun_t *pBVar13;
  int Fill;
  int Fill_00;
  int iVar14;
  int iVar15;
  long lVar16;
  word local_40;
  word local_38;
  
  local_40 = uTruthC;
  local_38 = uTruth1;
  if ((uTruth1 == 0) || (uTruthC == 0)) {
    __assert_fail("uTruth1 != 0 && uTruthC != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaShrink6.c"
                  ,0x119,
                  "int Shr_ObjPerformBidec(Shr_Man_t *, Bdc_Man_t *, Gia_Man_t *, Vec_Int_t *, word, word)"
                 );
  }
  iVar14 = vLeafLits->nSize;
  Bdc_ManDecompose(pManDec,(uint *)&local_38,(uint *)&local_40,iVar14,(Vec_Ptr_t *)0x0,1000);
  pBVar11 = Bdc_ManFunc(pManDec,0);
  Bdc_FuncSetCopyInt(pBVar11,1);
  if (0 < vLeafLits->nSize) {
    lVar16 = 0;
    do {
      iVar7 = vLeafLits->pArray[lVar16];
      lVar16 = lVar16 + 1;
      pBVar11 = Bdc_ManFunc(pManDec,(int)lVar16);
      if (iVar7 < 0) {
        __assert_fail("Var >= 0 && !(c >> 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                      ,0x10b,"int Abc_Var2Lit(int, int)");
      }
      Bdc_FuncSetCopyInt(pBVar11,iVar7 * 2);
    } while (lVar16 < vLeafLits->nSize);
  }
  iVar7 = Bdc_ManNodeNum(pManDec);
  iVar14 = iVar14 + 1;
  if (iVar14 < iVar7) {
    do {
      pBVar11 = Bdc_ManFunc(pManDec,iVar14);
      iVar10 = pNew->nObjs;
      pBVar12 = Bdc_FuncFanin0(pBVar11);
      uVar8 = Bdc_FuncCopyInt((Bdc_Fun_t *)((ulong)pBVar12 & 0xfffffffffffffffe));
      if ((int)uVar8 < 0) goto LAB_00713a2a;
      pBVar13 = Bdc_FuncFanin1(pBVar11);
      uVar9 = Bdc_FuncCopyInt((Bdc_Fun_t *)((ulong)pBVar13 & 0xfffffffffffffffe));
      if ((int)uVar9 < 0) goto LAB_00713a2a;
      uVar8 = Gia_ManHashAnd(pNew,(uint)pBVar12 & 1 ^ uVar8,(uint)pBVar13 & 1 ^ uVar9);
      Bdc_FuncSetCopyInt(pBVar11,uVar8);
      iVar15 = pNew->nObjs;
      if (iVar10 != iVar15) {
        if (iVar10 + 1 != iVar15) {
          __assert_fail("iLast + 1 == Gia_ManObjNum(pNew)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaShrink6.c"
                        ,0x127,
                        "int Shr_ObjPerformBidec(Shr_Man_t *, Bdc_Man_t *, Gia_Man_t *, Vec_Int_t *, word, word)"
                       );
        }
        if ((int)uVar8 < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                        ,0x10c,"int Abc_Lit2Var(int)");
        }
        uVar8 = uVar8 >> 1;
        if (iVar15 <= (int)uVar8) {
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                        ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        pGVar2 = pNew->pObjs;
        if ((int)(uint)*(undefined8 *)(pGVar2 + uVar8) < 0) {
LAB_00713a87:
          __assert_fail("Gia_ObjIsAnd(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                        ,0x20e,"void Gia_ObjSetAndLevel(Gia_Man_t *, Gia_Obj_t *)");
        }
        uVar9 = (uint)*(undefined8 *)(pGVar2 + uVar8) & 0x1fffffff;
        if (uVar9 == 0x1fffffff) goto LAB_00713a87;
        pGVar1 = pGVar2 + uVar8;
        pGVar4 = pGVar1 + -(ulong)uVar9;
        if ((pGVar4 < pGVar2) || (pGVar2 + iVar15 <= pGVar4)) goto LAB_007139ec;
        uVar8 = (int)((long)pGVar4 - (long)pGVar2 >> 2) * -0x55555555;
        pVVar3 = pNew->vLevels;
        Vec_IntFillExtra(pVVar3,uVar8 + 1,uVar9 * -3);
        if (((int)uVar8 < 0) || (pVVar3->nSize <= (int)uVar8)) {
LAB_00713a0b:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        pGVar2 = pGVar1 + -(ulong)(*(uint *)&pGVar1->field_0x4 & 0x1fffffff);
        pGVar4 = pNew->pObjs;
        if ((pGVar2 < pGVar4) || (pGVar4 + pNew->nObjs <= pGVar2)) goto LAB_007139ec;
        iVar10 = pVVar3->pArray[uVar8 & 0x7fffffff];
        uVar8 = (int)((long)pGVar2 - (long)pGVar4 >> 2) * -0x55555555;
        pVVar3 = pNew->vLevels;
        Vec_IntFillExtra(pVVar3,uVar8 + 1,Fill);
        if (((int)uVar8 < 0) || (pVVar3->nSize <= (int)uVar8)) goto LAB_00713a0b;
        pGVar2 = pNew->pObjs;
        if ((pGVar1 < pGVar2) || (pGVar2 + pNew->nObjs <= pGVar1)) {
LAB_007139ec:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                        ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        iVar15 = pVVar3->pArray[uVar8 & 0x7fffffff];
        uVar8 = (int)((long)pGVar1 - (long)pGVar2 >> 2) * -0x55555555;
        pVVar3 = pNew->vLevels;
        Vec_IntFillExtra(pVVar3,uVar8 + 1,Fill_00);
        if (((int)uVar8 < 0) || (pVVar3->nSize <= (int)uVar8)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        if (iVar15 < iVar10) {
          iVar15 = iVar10;
        }
        pVVar3->pArray[uVar8 & 0x7fffffff] = iVar15 + 1;
        pGVar2 = pNew->pObjs;
        if ((pGVar1 < pGVar2) || (pGVar2 + pNew->nObjs <= pGVar1)) goto LAB_007139ec;
        iVar10 = (int)((long)pGVar1 - (long)pGVar2 >> 2) * -0x55555555;
        uVar8 = iVar10 - (*(uint *)pGVar1 & 0x1fffffff);
        if (((int)uVar8 < 0) || (p->vObj2Fan->nSize <= (int)uVar8)) goto LAB_00713a0b;
        piVar5 = p->vObj2Fan->pArray;
        pVVar6 = p->vFanMem;
        iVar15 = piVar5[uVar8];
        piVar5[uVar8] = pVVar6->nSize;
        Vec_WrdPush(pVVar6,CONCAT44(iVar15,iVar10));
        pGVar2 = pNew->pObjs;
        if ((pGVar1 < pGVar2) || (pGVar2 + pNew->nObjs <= pGVar1)) goto LAB_007139ec;
        iVar10 = (int)((long)pGVar1 - (long)pGVar2 >> 2) * -0x55555555;
        uVar8 = iVar10 - (*(uint *)&pGVar1->field_0x4 & 0x1fffffff);
        if (((int)uVar8 < 0) || (p->vObj2Fan->nSize <= (int)uVar8)) goto LAB_00713a0b;
        piVar5 = p->vObj2Fan->pArray;
        pVVar6 = p->vFanMem;
        iVar15 = piVar5[uVar8];
        piVar5[uVar8] = pVVar6->nSize;
        Vec_WrdPush(pVVar6,CONCAT44(iVar15,iVar10));
        if (p->nNewSize <= pNew->nObjs) {
          __assert_fail("Gia_ManObjNum(pNew) < p->nNewSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaShrink6.c"
                        ,300,
                        "int Shr_ObjPerformBidec(Shr_Man_t *, Bdc_Man_t *, Gia_Man_t *, Vec_Int_t *, word, word)"
                       );
        }
      }
      iVar14 = iVar14 + 1;
    } while (iVar7 != iVar14);
  }
  pBVar11 = Bdc_ManRoot(pManDec);
  uVar8 = Bdc_FuncCopyInt((Bdc_Fun_t *)((ulong)pBVar11 & 0xfffffffffffffffe));
  if (-1 < (int)uVar8) {
    return (uint)pBVar11 & 1 ^ uVar8;
  }
LAB_00713a2a:
  __assert_fail("Lit >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                ,0x10f,"int Abc_LitNotCond(int, int)");
}

Assistant:

int Shr_ObjPerformBidec( Shr_Man_t * p, Bdc_Man_t * pManDec, Gia_Man_t * pNew, Vec_Int_t * vLeafLits, word uTruth1, word uTruthC )
{
    Bdc_Fun_t * pFunc;
    Gia_Obj_t * pObj;
    int i, iVar, iLit, nNodes, iLast;
    int nVars = Vec_IntSize(vLeafLits);
    assert( uTruth1 != 0 && uTruthC != 0 );
    Bdc_ManDecompose( pManDec, (unsigned *)&uTruth1, (unsigned *)&uTruthC, nVars, NULL, 1000 );
    Bdc_FuncSetCopyInt( Bdc_ManFunc(pManDec, 0), 1 );
    Vec_IntForEachEntry( vLeafLits, iVar, i )
        Bdc_FuncSetCopyInt( Bdc_ManFunc(pManDec, i+1), Abc_Var2Lit(iVar, 0) );
    nNodes = Bdc_ManNodeNum( pManDec );
    for ( i = nVars + 1; i < nNodes; i++ )
    {
        pFunc = Bdc_ManFunc( pManDec, i );
        iLast = Gia_ManObjNum(pNew);
        iLit  = Gia_ManHashAnd( pNew, Bdc_FunFanin0Copy(pFunc), Bdc_FunFanin1Copy(pFunc) );
        Bdc_FuncSetCopyInt( pFunc, iLit );
        if ( iLast == Gia_ManObjNum(pNew) )
            continue;
        assert( iLast + 1 == Gia_ManObjNum(pNew) );
        pObj = Gia_ManObj(pNew, Abc_Lit2Var(iLit));
        Gia_ObjSetAndLevel( pNew, pObj );
        Shr_ManAddFanout( p, Gia_ObjFaninId0p(pNew, pObj), Gia_ObjId(pNew, pObj) );
        Shr_ManAddFanout( p, Gia_ObjFaninId1p(pNew, pObj), Gia_ObjId(pNew, pObj) );
        assert( Gia_ManObjNum(pNew) < p->nNewSize );
    }
    return Bdc_FunObjCopy( Bdc_ManRoot(pManDec) );
}